

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  short *psVar1;
  Index *pIVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if ((((pExpr->op == 0xa9) || (pExpr->op == 0xa7)) && (0x3e < pExpr->iColumn)) &&
     (pExpr->iTable == ((pWalk->u).pIdxCover)->iCur)) {
    pIVar2 = ((pWalk->u).pIdxCover)->pIdx;
    uVar4 = 0;
    while (pIVar2->nColumn != uVar4) {
      psVar1 = pIVar2->aiColumn + uVar4;
      uVar4 = uVar4 + 1;
      if (*psVar1 == pExpr->iColumn) {
        return 0;
      }
    }
    pWalk->eCode = 1;
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                  /* Loop counter */
  const Index *pIdx;      /* The index of interest */
  const i16 *aiColumn;    /* Columns contained in the index */
  u16 nColumn;            /* Number of columns in the index */
  if( pExpr->op!=TK_COLUMN && pExpr->op!=TK_AGG_COLUMN ) return WRC_Continue;
  if( pExpr->iColumn<(BMS-1) ) return WRC_Continue;
  if( pExpr->iTable!=pWalk->u.pCovIdxCk->iTabCur ) return WRC_Continue;
  pIdx = pWalk->u.pCovIdxCk->pIdx;
  aiColumn = pIdx->aiColumn;
  nColumn = pIdx->nColumn;
  for(i=0; i<nColumn; i++){
    if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
  }
  pWalk->eCode = 1;
  return WRC_Abort;
}